

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O0

void __thiscall HEkkDual::minorUpdateDual(HEkkDual *this)

{
  reference pvVar1;
  HEkkDual *in_RDI;
  double dVar2;
  double in_stack_00000008;
  HEkkDualRow *in_stack_00000010;
  double dot;
  HighsInt i_1;
  HVector *this_ep;
  HighsInt ich;
  HighsInt i;
  HVector *in_stack_ffffffffffffffb8;
  HighsSparseMatrix *this_00;
  undefined8 in_stack_ffffffffffffffc8;
  HighsInt iCol;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  HVector *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  int in_stack_fffffffffffffff4;
  
  iCol = (HighsInt)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if ((in_RDI->theta_dual != 0.0) || (NAN(in_RDI->theta_dual))) {
    HEkkDualRow::updateDual(in_stack_00000010,in_stack_00000008);
    iCol = (HighsInt)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    if (in_RDI->slice_PRICE != 0) {
      for (in_stack_fffffffffffffff4 = 0;
          iCol = (HighsInt)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
          in_stack_fffffffffffffff4 < in_RDI->slice_num;
          in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
        std::vector<HEkkDualRow,_std::allocator<HEkkDualRow>_>::operator[]
                  (&in_RDI->slice_dualRow,(long)in_stack_fffffffffffffff4);
        HEkkDualRow::updateDual(in_stack_00000010,in_stack_00000008);
      }
    }
  }
  else {
    shiftCost((HEkkDual *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
              (HighsInt)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
              (double)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  in_RDI->workDual[in_RDI->variable_in] = 0.0;
  in_RDI->workDual[in_RDI->variable_out] = -in_RDI->theta_dual;
  shiftBack(in_RDI,iCol);
  HEkkDualRow::updateFlip
            ((HEkkDualRow *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffe8);
  for (iVar4 = 0; iVar4 < in_RDI->multi_num; iVar4 = iVar4 + 1) {
    if ((iVar4 == in_RDI->multi_iChoice) || (-1 < in_RDI->multi_choice[iVar4].row_out)) {
      for (iVar3 = 0; iVar3 < (in_RDI->dualRow).workCount; iVar3 = iVar3 + 1) {
        this_00 = in_RDI->a_matrix;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&(in_RDI->dualRow).workData,(long)iVar3);
        dVar2 = HighsSparseMatrix::computeDot(this_00,in_stack_ffffffffffffffb8,0);
        pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 operator[](&(in_RDI->dualRow).workData,(long)iVar3);
        in_RDI->multi_choice[iVar4].baseValue =
             -pvVar1->second * dVar2 + in_RDI->multi_choice[iVar4].baseValue;
      }
    }
  }
  return;
}

Assistant:

void HEkkDual::minorUpdateDual() {
  /**
   * 1. Update the dual solution
   *    XXX Data parallel (depends on the ap partition before)
   */
  if (theta_dual == 0) {
    shiftCost(variable_in, -workDual[variable_in]);
  } else {
    dualRow.updateDual(theta_dual);
    if (slice_PRICE) {
      for (HighsInt i = 0; i < slice_num; i++)
        slice_dualRow[i].updateDual(theta_dual);
    }
  }
  workDual[variable_in] = 0;
  workDual[variable_out] = -theta_dual;
  shiftBack(variable_out);

  /**
   * 2. Apply global bound flip
   */
  dualRow.updateFlip(multi_finish[multi_nFinish].col_BFRT);

  /**
   * 3. Apply local bound flips
   */
  for (HighsInt ich = 0; ich < multi_num; ich++) {
    if (ich == multi_iChoice || multi_choice[ich].row_out >= 0) {
      HVector* this_ep = &multi_choice[ich].row_ep;
      for (HighsInt i = 0; i < dualRow.workCount; i++) {
        double dot = a_matrix->computeDot(*this_ep, dualRow.workData[i].first);
        multi_choice[ich].baseValue -= dualRow.workData[i].second * dot;
      }
    }
  }
}